

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,float> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  undefined8 uVar1;
  undefined8 uVar2;
  rc_data *prVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  size_type sVar9;
  ulong uVar10;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>_>
  _Var11;
  solver_failure *this_00;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  EVP_PKEY_CTX *ctx;
  int *piVar18;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,float> *pbVar19;
  long lVar20;
  undefined4 in_register_00000084;
  long lVar21;
  long lVar22;
  long in_R9;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  
  lVar21 = CONCAT44(in_register_00000084,bk_max);
  if (r_size < 4) {
LAB_004fa7c5:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
              ();
LAB_004fa7ca:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
              ();
  }
  else {
    if (bk_max < bk_min) goto LAB_004fa7ca;
    *(int *)(this + 0x5c) = bk_min;
    *(int *)(this + 0x60) = bk_max;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
              *)(this + 0x20),(ulong)(uint)r_size);
    ctx = (EVP_PKEY_CTX *)(ulong)(uint)r_size;
    iVar8 = shared_subvector::init((shared_subvector *)this,ctx);
    if ((char)iVar8 == '\0') goto LAB_004fa7d4;
    pbVar19 = this;
    sVar9 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x58) = sVar9;
    if (sVar9 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar38 = vpbroadcastq_avx512f(ZEXT816(0xc));
      auVar39 = vpbroadcastq_avx512f(ZEXT816(0x18));
      auVar40 = vpbroadcastq_avx512f(ZEXT816(0x10));
      prVar3 = (reduced_cost->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
               ._M_head_impl;
      uVar10 = *(ulong *)(this + 0x20);
      uVar15 = (ulong)(r_size + 0xfU & 0xfffffff0);
      auVar41 = vpbroadcastq_avx512f();
      auVar42 = vpbroadcastq_avx512f();
      auVar43 = vpbroadcastq_avx512f();
      do {
        auVar44 = vpmullq_avx512dq(auVar36,auVar38);
        uVar6 = vpcmpuq_avx512f(auVar36,auVar41,2);
        auVar45 = vpmullq_avx512dq(auVar37,auVar38);
        uVar7 = vpcmpuq_avx512f(auVar37,auVar41,2);
        auVar46 = vpmullq_avx512dq(auVar37,auVar39);
        auVar37 = vpaddq_avx512f(auVar37,auVar40);
        uVar15 = uVar15 - 0x10;
        auVar24 = vgatherqps_avx512f(*(undefined8 *)((long)&prVar3->value + lVar21));
        bVar4 = (byte)uVar6;
        auVar26._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar24._8_8_;
        auVar26._0_8_ = (ulong)(bVar4 & 1) * auVar24._0_8_;
        auVar26._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar24._16_8_;
        auVar26._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar24._24_8_;
        vpaddq_avx512f(auVar42,auVar44);
        vpaddq_avx512f(auVar42,auVar45);
        auVar44 = vpaddq_avx512f(auVar43,auVar46);
        auVar24 = vgatherqps_avx512f(*(undefined8 *)(ctx + (long)prVar3));
        bVar5 = (byte)uVar7;
        auVar25._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar24._8_8_;
        auVar25._0_8_ = (ulong)(bVar5 & 1) * auVar24._0_8_;
        auVar25._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar24._16_8_;
        auVar25._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar24._24_8_;
        auVar45 = vpmullq_avx512dq(auVar36,auVar39);
        auVar36 = vpaddq_avx512f(auVar36,auVar40);
        auVar47 = vpaddq_avx512f(auVar43,auVar45);
        vscatterqps_avx512f(ZEXT864(uVar10) + auVar46,uVar7,auVar25);
        vscatterqps_avx512f(ZEXT864(uVar10) + auVar45,uVar6,auVar26);
        auVar26 = vpgatherqd_avx512f(*(undefined8 *)(in_R9 + 4));
        auVar24._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar26._4_4_;
        auVar24._0_4_ = (uint)(bVar4 & 1) * auVar26._0_4_;
        auVar24._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar26._8_4_;
        auVar24._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar26._12_4_;
        auVar24._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar26._16_4_;
        auVar24._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar26._20_4_;
        auVar24._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar26._24_4_;
        auVar24._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar26._28_4_;
        auVar26 = vpgatherqd_avx512f(*(undefined8 *)(pbVar19 + 4));
        auVar27._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar26._4_4_;
        auVar27._0_4_ = (uint)(bVar5 & 1) * auVar26._0_4_;
        auVar27._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar26._8_4_;
        auVar27._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar26._12_4_;
        auVar27._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar26._16_4_;
        auVar27._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar26._20_4_;
        auVar27._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar26._24_4_;
        auVar27._28_4_ = (uint)(byte)(uVar7 >> 7) * auVar26._28_4_;
        auVar30 = auVar44._0_32_;
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar30,uVar7,auVar27);
        auVar25 = auVar47._0_32_;
        vpscatterqd_avx512f(ZEXT832(0x10) + auVar25,uVar6,auVar24);
        auVar26 = vpgatherqd_avx512f(*(undefined8 *)(in_R9 + 8));
        auVar28._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar26._4_4_;
        auVar28._0_4_ = (uint)(bVar4 & 1) * auVar26._0_4_;
        auVar28._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar26._8_4_;
        auVar28._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar26._12_4_;
        auVar28._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar26._16_4_;
        auVar28._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar26._20_4_;
        auVar28._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar26._24_4_;
        auVar28._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar26._28_4_;
        auVar26 = vpgatherqd_avx512f(*(undefined8 *)(pbVar19 + 8));
        auVar29._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar26._4_4_;
        auVar29._0_4_ = (uint)(bVar5 & 1) * auVar26._0_4_;
        auVar29._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar26._8_4_;
        auVar29._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar26._12_4_;
        auVar29._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar26._16_4_;
        auVar29._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar26._20_4_;
        auVar29._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar26._24_4_;
        auVar29._28_4_ = (uint)(byte)(uVar7 >> 7) * auVar26._28_4_;
        vpscatterqd_avx512f(ZEXT832(0xc) + auVar30,uVar7,auVar29);
        auVar44 = vinserti64x4_avx512f(ZEXT3264(auVar29),auVar28,1);
        vpscatterqd_avx512f(ZEXT832(0xc) + auVar25,uVar6,auVar28);
        auVar44 = vpabsd_avx512f(auVar44);
        vpscatterqd_avx512f(ZEXT832(8) + auVar30,uVar7,auVar44._0_32_);
        auVar26 = vextracti64x4_avx512f(auVar44,1);
        vpscatterqd_avx512f(ZEXT832(8) + auVar25,uVar6,auVar26);
        vpscatterqd_avx512f(ZEXT832(0x14) + auVar30,uVar7,SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                           );
        vpscatterqd_avx512f(ZEXT832(0x14) + auVar25,uVar6,SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                           );
      } while (uVar15 != 0);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar21 = *(long *)(this + 0x20);
      lVar17 = *(long *)(this + 0x28);
      if (lVar21 != lVar17) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar21,lVar17,
                   (int)LZCOUNT((lVar17 - lVar21 >> 3) * -0x5555555555555555) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar21,lVar17);
        lVar21 = *(long *)(this + 0x20);
        lVar17 = *(long *)(this + 0x28);
      }
      iVar8 = *(int *)(this + 0x5c);
      iVar12 = *(int *)(this + 0x60);
      lVar16 = (lVar17 - lVar21 >> 3) * -0x5555555555555555;
      if (lVar17 != lVar21) {
        piVar18 = (int *)(lVar21 + 0xc);
        lVar20 = lVar16;
        do {
          if (*piVar18 < 0) {
            iVar8 = iVar8 + piVar18[-1];
            iVar12 = iVar12 + piVar18[-1];
            *(int *)(this + 0x5c) = iVar8;
            *(int *)(this + 0x60) = iVar12;
          }
          piVar18 = piVar18 + 6;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      *(undefined4 *)(lVar17 + -0x14) = *(undefined4 *)(lVar17 + -0x18);
      iVar14 = (int)lVar16;
      if (1 < iVar14) {
        lVar17 = (ulong)(iVar14 - 2) * 0x18;
        do {
          *(float *)(lVar21 + 4 + lVar17) =
               *(float *)(lVar21 + 0x1c + lVar17) + *(float *)(lVar21 + lVar17);
          lVar17 = lVar17 + -0x18;
        } while (lVar17 != -0x18);
      }
      if (iVar12 == iVar8) {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *)this);
      }
      lVar21 = *(long *)(this + 0x28);
      lVar17 = *(long *)(this + 0x20);
      uVar10 = (lVar21 - lVar17 >> 3) * -0x5555555555555555;
      if ((int)uVar10 != 0) {
        lVar16 = *(long *)this;
        lVar20 = *(long *)(this + 8);
        uVar13 = *(uint *)(this + 0x58);
        lVar22 = 0;
        do {
          uVar15 = (ulong)uVar13;
          if (*(int *)(lVar17 + 0xc + lVar22) < 1) {
            if ((ulong)(lVar20 - lVar16) <= uVar15) goto LAB_004fa7c0;
            bVar23 = *(char *)(lVar16 + uVar15) == '\0';
          }
          else {
            if ((ulong)(lVar20 - lVar16) <= uVar15) {
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
                        ();
LAB_004fa7c0:
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
                        ();
              goto LAB_004fa7c5;
            }
            bVar23 = *(char *)(lVar16 + uVar15) != '\0';
          }
          uVar13 = uVar13 + 1;
          *(uint *)(lVar17 + 0x14 + lVar22) = (uint)bVar23;
          lVar22 = lVar22 + 0x18;
        } while ((uVar10 & 0xffffffff) * 0x18 != lVar22);
      }
      if (lVar17 != lVar21) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar17,lVar21,(int)LZCOUNT(uVar10) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar17,lVar21);
      }
      _Var11 = std::
               __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                         (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
      auVar36 = vpbroadcastq_avx512f(ZEXT816(0xc));
      auVar37 = vpbroadcastq_avx512f(ZEXT816(0x18));
      auVar38 = vpbroadcastq_avx512f(ZEXT816(0x10));
      lVar21 = *(long *)(this + 0x20);
      lVar17 = (long)*(item **)(this + 0x28) - lVar21;
      if (lVar17 != 0) {
        auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        prVar3 = (reduced_cost->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        auVar41 = vpbroadcastq_avx512f();
        lVar17 = (lVar17 >> 3) * -0x5555555555555555;
        uVar10 = lVar17 + 0xfU & 0xfffffffffffffff0;
        auVar42 = vpbroadcastq_avx512f();
        auVar43 = vpbroadcastq_avx512f();
        do {
          auVar44 = vpmullq_avx512dq(auVar39,auVar37);
          uVar15 = vpcmpuq_avx512f(auVar39,auVar42,2);
          auVar45 = vpmullq_avx512dq(auVar40,auVar37);
          uVar6 = vpcmpuq_avx512f(auVar40,auVar42,2);
          auVar46 = vpmullq_avx512dq(auVar40,auVar36);
          auVar40 = vpaddq_avx512f(auVar40,auVar38);
          uVar10 = uVar10 - 0x10;
          auVar26 = vgatherqps_avx512f(*(undefined8 *)(lVar21 + uVar10));
          bVar4 = (byte)uVar15;
          auVar30._8_8_ = (ulong)((byte)(uVar15 >> 1) & 1) * auVar26._8_8_;
          auVar30._0_8_ = (ulong)(bVar4 & 1) * auVar26._0_8_;
          auVar30._16_8_ = (ulong)((byte)(uVar15 >> 2) & 1) * auVar26._16_8_;
          auVar30._24_8_ = (ulong)((byte)(uVar15 >> 3) & 1) * auVar26._24_8_;
          vpaddq_avx512f(auVar41,auVar44);
          vpaddq_avx512f(auVar41,auVar45);
          auVar44 = vpaddq_avx512f(auVar43,auVar46);
          auVar26 = vgatherqps_avx512f(*(undefined8 *)(lVar21 + -0x5555555555555555));
          bVar5 = (byte)uVar6;
          auVar31._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar26._8_8_;
          auVar31._0_8_ = (ulong)(bVar5 & 1) * auVar26._0_8_;
          auVar31._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar26._16_8_;
          auVar31._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar26._24_8_;
          auVar45 = vpmullq_avx512dq(auVar39,auVar36);
          auVar39 = vpaddq_avx512f(auVar39,auVar38);
          auVar47 = vpaddq_avx512f(auVar43,auVar45);
          vscatterqps_avx512f(ZEXT864(prVar3) + auVar46,uVar6,auVar31);
          vscatterqps_avx512f(ZEXT864(prVar3) + auVar45,uVar15,auVar30);
          auVar26 = vpgatherqd_avx512f(*(undefined8 *)(lVar17 + 0xf));
          auVar32._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar26._4_4_;
          auVar32._0_4_ = (uint)(bVar4 & 1) * auVar26._0_4_;
          auVar32._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar26._8_4_;
          auVar32._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar26._12_4_;
          auVar32._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar26._16_4_;
          auVar32._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar26._20_4_;
          auVar32._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar26._24_4_;
          auVar32._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar26._28_4_;
          uVar1._0_4_ = prVar3[1].id;
          uVar1._4_4_ = prVar3[1].f;
          auVar26 = vpgatherqd_avx512f(uVar1);
          auVar33._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar26._4_4_;
          auVar33._0_4_ = (uint)(bVar5 & 1) * auVar26._0_4_;
          auVar33._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar26._8_4_;
          auVar33._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar26._12_4_;
          auVar33._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar26._16_4_;
          auVar33._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar26._20_4_;
          auVar33._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar26._24_4_;
          auVar33._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar26._28_4_;
          vpscatterqd_avx512f(ZEXT832(4) + auVar44._0_32_,uVar6,auVar33);
          vpscatterqd_avx512f(ZEXT832(4) + auVar47._0_32_,uVar15,auVar32);
          auVar26 = vpgatherqd_avx512f(*(undefined8 *)(lVar17 + 0xb));
          auVar34._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar26._4_4_;
          auVar34._0_4_ = (uint)(bVar4 & 1) * auVar26._0_4_;
          auVar34._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar26._8_4_;
          auVar34._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar26._12_4_;
          auVar34._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar26._16_4_;
          auVar34._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar26._20_4_;
          auVar34._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar26._24_4_;
          auVar34._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar26._28_4_;
          uVar2._0_4_ = prVar3[1].value;
          uVar2._4_4_ = prVar3[1].id;
          auVar26 = vpgatherqd_avx512f(uVar2);
          auVar35._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar26._4_4_;
          auVar35._0_4_ = (uint)(bVar5 & 1) * auVar26._0_4_;
          auVar35._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar26._8_4_;
          auVar35._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar26._12_4_;
          auVar35._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar26._16_4_;
          auVar35._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar26._20_4_;
          auVar35._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar26._24_4_;
          auVar35._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar26._28_4_;
          vpscatterqd_avx512f(ZEXT832(8) + auVar44._0_32_,uVar6,auVar35);
          vpscatterqd_avx512f(ZEXT832(8) + auVar47._0_32_,uVar15,auVar34);
        } while (uVar10 != 0);
      }
      if (_Var11._M_current == *(item **)(this + 0x28)) {
        uVar13 = -(uint)(*(int *)(lVar21 + 0x14) == 0) | r_size;
      }
      else {
        uVar13 = (int)((ulong)((long)_Var11._M_current - lVar21) >> 3) * -0x55555555 - 1;
      }
      return uVar13;
    }
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>>>
            ();
LAB_004fa7d4:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }